

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

tuple * tuple_generate_from_ISI(uint32_t X,parameters *P)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  long in_RDX;
  uint32_t in_ESI;
  tuple *in_RDI;
  uint32_t v;
  uint32_t y;
  uint32_t B;
  uint32_t A;
  
  uVar1 = (*(int *)(in_RDX + 8) + 1) * 0x281b +
          in_ESI * (*(int *)(in_RDX + 8) * 0x3e5 + 0xd157U | 1);
  uVar2 = Rand(uVar1,0,0x100000);
  iVar3 = Deg(uVar2,*(int *)(in_RDX + 0x1c));
  in_RDI->d = iVar3;
  uVar2 = Rand(uVar1,1,*(int *)(in_RDX + 0x1c) + -1);
  in_RDI->a = uVar2 + 1;
  uVar1 = Rand(uVar1,2,*(int *)(in_RDX + 0x1c));
  in_RDI->b = uVar1;
  if (in_RDI->d < 4) {
    uVar1 = Rand(in_ESI,3,2);
    in_RDI->d1 = uVar1 + 2;
  }
  else {
    in_RDI->d1 = 2;
  }
  uVar1 = Rand(in_ESI,4,*(int *)(in_RDX + 0x24) + -1);
  in_RDI->a1 = uVar1 + 1;
  uVar1 = Rand(in_ESI,5,*(int *)(in_RDX + 0x24));
  in_RDI->b1 = uVar1;
  return in_RDI;
}

Assistant:

tuple tuple_generate_from_ISI(uint32_t X, const parameters* P)
{
	const uint32_t A = (53591 + P->J * 997) | 0x1;
	const uint32_t B = 10267 * (P->J + 1);
	const uint32_t y = (B + X*A);
	const uint32_t v = Rand(y, 0, 1 << 20);

	tuple T;
	T.d = Deg(v, P->W);
	T.a = 1 + Rand(y, 1, P->W - 1);
	T.b = Rand(y, 2, P->W);
	if (T.d < 4) {
		T.d1 = 2 + Rand(X, 3, 2);
	} else {
		T.d1 = 2;
	}
	T.a1 = 1 + Rand(X, 4, P->P1 - 1);
	T.b1 = Rand(X, 5, P->P1);

	return T;
}